

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

bool __thiscall Parser::checkMacroDefinition(Parser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int *piVar2;
  long *plVar3;
  TokenizerPosition start;
  pointer pCVar4;
  Tokenizer *this_00;
  bool bVar5;
  bool bVar6;
  Token *pTVar7;
  Token *pTVar8;
  iterator iVar9;
  mapped_type *this_01;
  long lVar10;
  iterator iVar11;
  ulong uVar12;
  Identifier name;
  vector<Expression,_std::allocator<Expression>_> parameters;
  Identifier local_108;
  vector<Expression,_std::allocator<Expression>_> local_e8;
  ParserMacro local_d0;
  vector<Token,_std::allocator<Token>_> local_48;
  
  pTVar7 = Tokenizer::peekToken
                     ((this->entries).
                      super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                      _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer,0);
  if (pTVar7->type != Identifier) {
    return false;
  }
  if (*(__index_type *)
       ((long)&(pTVar7->value).
               super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>.
               super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
       + 0x20) != '\x04') {
LAB_001465e2:
    __assert_fail("std::holds_alternative<Identifier>(value)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Kingcom[P]armips/Parser/Tokenizer.h"
                  ,0x4d,"const Identifier &Token::identifierValue() const");
  }
  piVar2 = *(int **)&(pTVar7->value).
                     super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                     super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     ._M_u;
  if ((char)*piVar2 != '.') {
    return false;
  }
  if (*(long *)((long)&(pTVar7->value).
                       super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                       super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
               + 8) != 6) {
    return false;
  }
  if ((short)piVar2[1] != 0x6f72 || *piVar2 != 0x63616d2e) {
    return false;
  }
  Tokenizer::eatTokens
            ((this->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer,1);
  if (this->initializingMacro == true) {
    printError<>(this,pTVar7,"Nested macro definitions not allowed");
    iVar11._M_node =
         (_List_node_base *)
         (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
    if ((_List_node_base *)((TokenizerPosition *)((long)(iVar11._M_node + 1) + 8))->it ==
        iVar11._M_node) {
      return true;
    }
    do {
      pTVar7 = Tokenizer::nextToken((Tokenizer *)iVar11._M_node);
      if (pTVar7->type == Identifier) {
        if (*(__index_type *)
             ((long)&(pTVar7->value).
                     super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                     super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                     .
                     super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
             + 0x20) != '\x04') goto LAB_001465e2;
        if ((*(long *)((long)&(pTVar7->value).
                              super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                              .
                              super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                      + 8) == 9) &&
           (plVar3 = *(long **)&(pTVar7->value).
                                super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                ._M_u, (char)plVar3[1] == 'o' && *plVar3 == 0x7263616d646e652e)) {
          return true;
        }
      }
      iVar11._M_node =
           (_List_node_base *)
           (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
      if ((_List_node_base *)((TokenizerPosition *)((long)(iVar11._M_node + 1) + 8))->it ==
          iVar11._M_node) {
        return true;
      }
    } while( true );
  }
  local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_start = (Expression *)0x0;
  local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = parseExpressionList(this,&local_e8,1,-1);
  if (!bVar6) {
    bVar6 = false;
    goto LAB_00146462;
  }
  local_d0.name._name._M_dataplus._M_p = (pointer)&local_d0.name._name.field_2;
  local_d0.name._name._M_string_length = 0;
  local_d0.name._name.field_2._M_local_buf[0] = '\0';
  local_d0.parameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_d0.parameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d0.parameters.super__Vector_base<Identifier,_std::allocator<Identifier>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_d0.counter = 0;
  local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0.labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar6 = Expression::evaluateIdentifier
                    (local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>._M_impl.
                     super__Vector_impl_data._M_start,&local_d0.name);
  if (bVar6) {
    if (1 < (ulong)(((long)local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)local_e8.super__Vector_base<Expression,_std::allocator<Expression>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555)) {
      uVar12 = 1;
      lVar10 = 0x18;
      paVar1 = &local_108._name.field_2;
      do {
        local_108._name._M_string_length = 0;
        local_108._name.field_2._M_allocated_capacity =
             local_108._name.field_2._M_allocated_capacity & 0xffffffffffffff00;
        local_108._name._M_dataplus._M_p = (pointer)paVar1;
        bVar6 = Expression::evaluateIdentifier
                          ((Expression *)
                           ((long)&((local_e8.
                                     super__Vector_base<Expression,_std::allocator<Expression>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->expression).
                                   super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr + lVar10),&local_108);
        if (!bVar6) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._name._M_dataplus._M_p != paVar1) {
            operator_delete(local_108._name._M_dataplus._M_p,
                            local_108._name.field_2._M_allocated_capacity + 1);
          }
          bVar6 = false;
          goto LAB_00146428;
        }
        std::vector<Identifier,_std::allocator<Identifier>_>::push_back
                  (&local_d0.parameters,&local_108);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._name._M_dataplus._M_p != paVar1) {
          operator_delete(local_108._name._M_dataplus._M_p,
                          local_108._name.field_2._M_allocated_capacity + 1);
        }
        uVar12 = uVar12 + 1;
        lVar10 = lVar10 + 0x18;
      } while (uVar12 < (ulong)(((long)local_e8.
                                       super__Vector_base<Expression,_std::allocator<Expression>_>.
                                       _M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_e8.
                                       super__Vector_base<Expression,_std::allocator<Expression>_>.
                                       _M_impl.super__Vector_impl_data._M_start >> 3) *
                               -0x5555555555555555));
    }
    pTVar8 = Tokenizer::nextToken
                       ((this->entries).
                        super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
                        _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
    if (pTVar8->type != Separator) {
      printError<>(this,pTVar7,"Macro directive not terminated");
      goto LAB_00146426;
    }
    iVar11._M_node =
         (_List_node_base *)
         (this->entries).super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>.
         _M_impl.super__Vector_impl_data._M_finish[-1].tokenizer;
    start.it._M_node = (iterator)iVar11._M_node[1]._M_prev;
    if (start.it._M_node != (iterator)iVar11._M_node) {
      do {
        pTVar8 = Tokenizer::nextToken((Tokenizer *)iVar11._M_node);
        if (pTVar8->type == Identifier) {
          if (*(__index_type *)
               ((long)&(pTVar8->value).
                       super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>.
                       super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                       .
                       super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
               + 0x20) != '\x04') goto LAB_001465e2;
          if ((*(long *)((long)&(pTVar8->value).
                                super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                .
                                super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                        + 8) == 9) &&
             (plVar3 = *(long **)&(pTVar8->value).
                                  super__Variant_base<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Move_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Copy_assign_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Move_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Copy_ctor_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  .
                                  super__Variant_storage_alias<std::monostate,_long,_double,_StringLiteral,_Identifier>
                                  ._M_u, (char)plVar3[1] == 'o' && *plVar3 == 0x7263616d646e652e)) {
            bVar5 = true;
            goto LAB_001463e6;
          }
        }
        iVar11._M_node =
             (_List_node_base *)
             (this->entries).
             super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].tokenizer;
      } while ((_List_node_base *)((TokenizerPosition *)((long)(iVar11._M_node + 1) + 8))->it !=
               iVar11._M_node);
    }
    bVar5 = false;
LAB_001463e6:
    pCVar4 = (this->conditionStack).
             super__Vector_base<Parser::ConditionInfo,_std::allocator<Parser::ConditionInfo>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if (pCVar4[-1].inUnknownBlock == true) {
      printError<>(this,pTVar7,
                   "Macro definition not allowed inside of block with non-trivial condition");
      goto LAB_00146426;
    }
    bVar6 = true;
    if (pCVar4[-1].inTrueBlock == true) {
      iVar9 = std::
              _Rb_tree<Identifier,_std::pair<const_Identifier,_ParserMacro>,_std::_Select1st<std::pair<const_Identifier,_ParserMacro>_>,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
              ::find(&(this->macros)._M_t,&local_d0.name);
      if ((_Rb_tree_header *)iVar9._M_node != &(this->macros)._M_t._M_impl.super__Rb_tree_header) {
        printError<Identifier>(this,pTVar7,"Macro \"%s\" already defined",&local_d0.name);
        goto LAB_00146426;
      }
      if (bVar5) {
        this_00 = (this->entries).
                  super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>._M_impl.
                  super__Vector_impl_data._M_finish[-1].tokenizer;
        Tokenizer::getTokens
                  (&local_48,this_00,start,
                   (TokenizerPosition)((this_00->position).it._M_node)->_M_prev);
        local_108._name.field_2._M_allocated_capacity =
             (size_type)
             local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_108._name._M_string_length =
             (size_type)
             local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_108._name._M_dataplus._M_p =
             (pointer)local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
                      super__Vector_impl_data._M_start;
        local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_d0.content.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_48.super__Vector_base<Token,_std::allocator<Token>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::vector<Token,_std::allocator<Token>_>::~vector
                  ((vector<Token,_std::allocator<Token>_> *)&local_108);
        std::vector<Token,_std::allocator<Token>_>::~vector(&local_48);
        pTVar8 = Tokenizer::nextToken
                           ((this->entries).
                            super__Vector_base<Parser::FileEntry,_std::allocator<Parser::FileEntry>_>
                            ._M_impl.super__Vector_impl_data._M_finish[-1].tokenizer);
        if (pTVar8->type != Separator) {
          printError<>(this,pTVar7,"Endmacro directive not terminated");
          goto LAB_00146426;
        }
        this_01 = std::
                  map<Identifier,_ParserMacro,_std::less<Identifier>,_std::allocator<std::pair<const_Identifier,_ParserMacro>_>_>
                  ::operator[](&this->macros,&local_d0.name);
        ParserMacro::operator=(this_01,&local_d0);
      }
      else {
        printError<Identifier>(this,pTVar7,"Macro \"%s\" not terminated",&local_d0.name);
      }
    }
  }
  else {
LAB_00146426:
    bVar6 = false;
  }
LAB_00146428:
  std::vector<Token,_std::allocator<Token>_>::~vector(&local_d0.content);
  std::
  _Rb_tree<Identifier,_Identifier,_std::_Identity<Identifier>,_std::less<Identifier>,_std::allocator<Identifier>_>
  ::~_Rb_tree(&local_d0.labels._M_t);
  std::vector<Identifier,_std::allocator<Identifier>_>::~vector(&local_d0.parameters);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0.name._name._M_dataplus._M_p != &local_d0.name._name.field_2) {
    operator_delete(local_d0.name._name._M_dataplus._M_p,
                    CONCAT71(local_d0.name._name.field_2._M_allocated_capacity._1_7_,
                             local_d0.name._name.field_2._M_local_buf[0]) + 1);
  }
LAB_00146462:
  std::vector<Expression,_std::allocator<Expression>_>::~vector(&local_e8);
  return bVar6;
}

Assistant:

bool Parser::checkMacroDefinition()
{
	const Token& first = peekToken();
	if (first.type != TokenType::Identifier)
		return false;

	const auto &identifier = first.identifierValue();
	if (!identifier.startsWith('.') || first.identifierValue() != ".macro")
		return false;

	eatToken();

	// nested macro definitions are not allowed
	if (initializingMacro)
	{
		printError(first, "Nested macro definitions not allowed");
		while (!atEnd())
		{
			const Token& token = nextToken();
			if (token.type == TokenType::Identifier && token.identifierValue() == ".endmacro")
				break;
		}

		return true;
	}

	std::vector<Expression> parameters;
	if (!parseExpressionList(parameters,1,-1))
		return false;

	ParserMacro macro;
	macro.counter = 0;

	// load name
	if (!parameters[0].evaluateIdentifier(macro.name))
		return false;

	// load parameters
	for (size_t i = 1; i < parameters.size(); i++)
	{
		Identifier name;
		if (!parameters[i].evaluateIdentifier(name))
			return false;

		macro.parameters.push_back(name);
	}

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, "Macro directive not terminated");
		return false;
	}

	// load macro content

	TokenizerPosition start = getTokenizer()->getPosition();
	bool valid = false;
	while (!atEnd())
	{
		const Token& tok = nextToken();
		if (tok.type == TokenType::Identifier && tok.identifierValue() == ".endmacro")
		{
			valid = true;
			break;
		}
	}

	// Macros have to be defined at parse time, so they can't be defined in blocks
	// with non-trivial conditions
	if (isInsideUnknownBlock())
	{
		printError(first, "Macro definition not allowed inside of block with non-trivial condition");
		return false;
	}

	// if we are in a known false block, don't define the macro
	if (!isInsideTrueBlock())
		return true;
	
	// duplicate check
	if (macros.find(macro.name) != macros.end())
	{
		printError(first, "Macro \"%s\" already defined", macro.name);
		return false;
	}

	// no .endmacro, not valid
	if (!valid)
	{
		printError(first, "Macro \"%s\" not terminated", macro.name);
		return true;
	}

	// get content
	TokenizerPosition end = getTokenizer()->getPosition().previous();
	macro.content = getTokenizer()->getTokens(start,end);

	if(nextToken().type != TokenType::Separator)
	{
		printError(first, "Endmacro directive not terminated");
		return false;
	}

	macros[macro.name] = macro;
	return true;
}